

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileLibraryTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileLibraryTargetGenerator::WriteRuleFiles(cmMakefileLibraryTargetGenerator *this)

{
  cmGeneratorTarget *pcVar1;
  bool bVar2;
  TargetType TVar3;
  allocator<char> local_41;
  string local_40;
  
  cmMakefileTargetGenerator::CreateRuleFile(&this->super_cmMakefileTargetGenerator);
  cmMakefileTargetGenerator::WriteCommonCodeRules(&this->super_cmMakefileTargetGenerator);
  cmMakefileTargetGenerator::WriteTargetLanguageFlags(&this->super_cmMakefileTargetGenerator);
  cmMakefileTargetGenerator::WriteTargetBuildRules(&this->super_cmMakefileTargetGenerator);
  cmMakefileTargetGenerator::WriteTargetLinkDependRules(&this->super_cmMakefileTargetGenerator);
  TVar3 = cmGeneratorTarget::GetType
                    ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                     GeneratorTarget);
  switch(TVar3) {
  case STATIC_LIBRARY:
    WriteStaticLibraryRules(this);
    break;
  case SHARED_LIBRARY:
    WriteSharedLibraryRules(this,false);
    pcVar1 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
              (&local_40,&this->super_cmMakefileTargetGenerator);
    bVar2 = cmGeneratorTarget::NeedRelinkBeforeInstall(pcVar1,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    if (bVar2) {
      WriteSharedLibraryRules(this,true);
    }
    break;
  case MODULE_LIBRARY:
    WriteModuleLibraryRules(this,false);
    pcVar1 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
              (&local_40,&this->super_cmMakefileTargetGenerator);
    bVar2 = cmGeneratorTarget::NeedRelinkBeforeInstall(pcVar1,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    if (bVar2) {
      WriteModuleLibraryRules(this,true);
    }
    break;
  case OBJECT_LIBRARY:
    WriteObjectLibraryRules(this);
    break;
  default:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Unknown Library Type",&local_41);
    cmSystemTools::Error(&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  cmMakefileTargetGenerator::WriteTargetCleanRules(&this->super_cmMakefileTargetGenerator);
  cmMakefileTargetGenerator::WriteTargetDependRules(&this->super_cmMakefileTargetGenerator);
  (*(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
    _vptr_cmCommonTargetGenerator[6])(this);
  return;
}

Assistant:

void cmMakefileLibraryTargetGenerator::WriteRuleFiles()
{
  // create the build.make file and directory, put in the common blocks
  this->CreateRuleFile();

  // write rules used to help build object files
  this->WriteCommonCodeRules();

  // write the per-target per-language flags
  this->WriteTargetLanguageFlags();

  // write in rules for object files and custom commands
  this->WriteTargetBuildRules();

  // Write in the rules for the link dependency file
  this->WriteTargetLinkDependRules();

  // write the link rules
  // Write the rule for this target type.
  switch (this->GeneratorTarget->GetType()) {
    case cmStateEnums::STATIC_LIBRARY:
      this->WriteStaticLibraryRules();
      break;
    case cmStateEnums::SHARED_LIBRARY:
      this->WriteSharedLibraryRules(false);
      if (this->GeneratorTarget->NeedRelinkBeforeInstall(
            this->GetConfigName())) {
        // Write rules to link an installable version of the target.
        this->WriteSharedLibraryRules(true);
      }
      break;
    case cmStateEnums::MODULE_LIBRARY:
      this->WriteModuleLibraryRules(false);
      if (this->GeneratorTarget->NeedRelinkBeforeInstall(
            this->GetConfigName())) {
        // Write rules to link an installable version of the target.
        this->WriteModuleLibraryRules(true);
      }
      break;
    case cmStateEnums::OBJECT_LIBRARY:
      this->WriteObjectLibraryRules();
      break;
    default:
      // If language is not known, this is an error.
      cmSystemTools::Error("Unknown Library Type");
      break;
  }

  // Write clean target
  this->WriteTargetCleanRules();

  // Write the dependency generation rule.  This must be done last so
  // that multiple output pair information is available.
  this->WriteTargetDependRules();

  // close the streams
  this->CloseFileStreams();
}